

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

void __thiscall adios2::core::Group::Group(Group *this,string *path,char delimiter,IO *io)

{
  TreeMap *__p;
  _Rb_tree_header *p_Var1;
  __shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__cxx11::string::string((string *)this,(string *)path);
  this->groupDelimiter = delimiter;
  (this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->ADIOS_root,"_ADIOS_ROOT_",(allocator *)&local_30);
  (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_IO = io;
  if ((this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    __p = (TreeMap *)operator_new(0x30);
    p_Var1 = &(__p->treeMap)._M_t._M_impl.super__Rb_tree_header;
    (__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&(__p->treeMap)._M_t._M_impl = 0;
    *(undefined8 *)&(__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::__shared_ptr<adios2::core::Group::TreeMap,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<adios2::core::Group::TreeMap,void>
              ((__shared_ptr<adios2::core::Group::TreeMap,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               __p);
    std::__shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->mapPtr).
                super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>,
               &local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return;
}

Assistant:

Group::Group(std::string path, char delimiter, IO &io)
: currentPath(path), groupDelimiter(delimiter), m_IO(io)
{
    if (mapPtr == nullptr)
    {
        mapPtr = std::shared_ptr<TreeMap>(new TreeMap());
    }
}